

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_analysis.cc
# Opt level: O2

variable_access_map_t *
tchecker::variable_access(variable_access_map_t *__return_storage_ptr__,system_t *system)

{
  process_id_t pid;
  edges_collection_const_iterator_t __r;
  typed_expression_t *ptVar1;
  typed_statement_t *stmt;
  const_iterator __r_00;
  __node_base *p_Var2;
  range_t<tchecker::system::edges_collection_const_iterator_t,_tchecker::system::edges_collection_const_iterator_t>
  rVar3;
  range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>
  rVar4;
  edge_const_shared_ptr_t edge;
  const_iterator local_b0;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  clock_ids;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  (__return_storage_ptr__->_empty_vid_set).
  super_flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
  .m_data.m_seq.m_holder.m_size = 0;
  (__return_storage_ptr__->_empty_vid_set).
  super_flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
  .m_data.m_seq.m_holder.m_capacity = 0;
  (__return_storage_ptr__->_empty_pid_set).
  super_flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
  .m_data.m_seq.m_holder.m_capacity = 0;
  (__return_storage_ptr__->_empty_vid_set).
  super_flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
  .m_data.m_seq.m_holder.m_start = (pointer)0x0;
  (__return_storage_ptr__->_empty_pid_set).
  super_flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
  .m_data.m_seq.m_holder.m_start = (pointer)0x0;
  (__return_storage_ptr__->_empty_pid_set).
  super_flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
  .m_data.m_seq.m_holder.m_size = 0;
  (__return_storage_ptr__->_p2v_map).m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  (__return_storage_ptr__->_p2v_map).m_flat_tree.m_data.m_seq.m_holder.m_capacity = 0;
  (__return_storage_ptr__->_v2p_map).m_flat_tree.m_data.m_seq.m_holder.m_capacity = 0;
  (__return_storage_ptr__->_p2v_map).m_flat_tree.m_data.m_seq.m_holder.m_start = (pointer)0x0;
  (__return_storage_ptr__->_v2p_map).m_flat_tree.m_data.m_seq.m_holder.m_start = (pointer)0x0;
  (__return_storage_ptr__->_v2p_map).m_flat_tree.m_data.m_seq.m_holder.m_size = 0;
  rVar3 = tchecker::system::edges_t::edges(&(system->super_system_t).super_system_t.super_edges_t);
  while (local_b0._M_current =
              (shared_ptr<tchecker::system::edge_t> *)rVar3._end.super_const_iterator._M_current,
        __r = rVar3._begin.super_const_iterator._M_current,
        __r.super_const_iterator._M_current != (const_iterator)local_b0._M_current) {
    std::__shared_ptr<tchecker::system::edge_t_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<tchecker::system::edge_t,void>
              ((__shared_ptr<tchecker::system::edge_t_const,(__gnu_cxx::_Lock_policy)2> *)&edge,
               (__shared_ptr<tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2> *)
               __r.super_const_iterator._M_current);
    ptVar1 = ta::system_t::guard(system,(edge.
                                         super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr)->_id);
    add_accesses(ptVar1,(edge.
                         super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_pid,__return_storage_ptr__);
    stmt = ta::system_t::statement
                     (system,(edge.
                              super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->_id);
    pid = (edge.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr)->_pid;
    clock_ids._M_h._M_buckets = &clock_ids._M_h._M_single_bucket;
    clock_ids._M_h._M_bucket_count = 1;
    p_Var2 = &clock_ids._M_h._M_before_begin;
    clock_ids._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    clock_ids._M_h._M_element_count = 0;
    clock_ids._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    clock_ids._M_h._M_rehash_policy._M_next_resize = 0;
    clock_ids._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_68._M_buckets = &local_68._M_single_bucket;
    local_68._M_bucket_count = 1;
    local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_element_count = 0;
    local_68._M_rehash_policy._M_max_load_factor = 1.0;
    local_68._M_rehash_policy._M_next_resize = 0;
    local_68._M_single_bucket = (__node_base_ptr)0x0;
    extract_read_variables
              (stmt,&clock_ids,
               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)&local_68);
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      variable_access_map_t::add
                (__return_storage_ptr__,(variable_id_t)*(size_type *)(p_Var2 + 1),VTYPE_CLOCK,
                 VACCESS_READ,pid);
    }
    p_Var2 = &local_68._M_before_begin;
    while( true ) {
      p_Var2 = p_Var2->_M_nxt;
      if (p_Var2 == (__node_base *)0x0) break;
      variable_access_map_t::add
                (__return_storage_ptr__,(variable_id_t)*(size_type *)(p_Var2 + 1),VTYPE_INTVAR,
                 VACCESS_READ,pid);
    }
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::clear(&clock_ids._M_h);
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::clear(&local_68);
    extract_written_variables
              (stmt,(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)&clock_ids._M_h,
               (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                *)&local_68);
    p_Var2 = &clock_ids._M_h._M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      variable_access_map_t::add
                (__return_storage_ptr__,(variable_id_t)*(size_type *)(p_Var2 + 1),VTYPE_CLOCK,
                 VACCESS_WRITE,pid);
    }
    p_Var2 = &local_68._M_before_begin;
    while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
      variable_access_map_t::add
                (__return_storage_ptr__,(variable_id_t)*(size_type *)(p_Var2 + 1),VTYPE_INTVAR,
                 VACCESS_WRITE,pid);
    }
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&local_68);
    std::
    _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable(&clock_ids._M_h);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&edge.super___shared_ptr<const_tchecker::system::edge_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    rVar3._end.super_const_iterator._M_current = (const_iterator)(const_iterator)local_b0._M_current
    ;
    rVar3._begin.super_const_iterator._M_current =
         (const_iterator)(const_iterator)((long)__r.super_const_iterator._M_current + 0x10);
  }
  rVar4 = tchecker::system::locs_t::locations(&(system->super_system_t).super_system_t.super_locs_t)
  ;
  for (__r_00._M_current =
            (shared_ptr<tchecker::system::loc_t> *)rVar4._begin.super_const_iterator._M_current;
      (const_iterator)__r_00._M_current !=
      rVar4._end.super_const_iterator._M_current.super_const_iterator;
      __r_00._M_current = __r_00._M_current + 1) {
    std::__shared_ptr<tchecker::system::loc_t_const,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<tchecker::system::loc_t,void>
              ((__shared_ptr<tchecker::system::loc_t_const,(__gnu_cxx::_Lock_policy)2> *)&clock_ids,
               &(__r_00._M_current)->
                super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>);
    ptVar1 = ta::system_t::invariant(system,*(loc_id_t *)((long)clock_ids._M_h._M_buckets + 4));
    add_accesses(ptVar1,*(process_id_t *)clock_ids._M_h._M_buckets,__return_storage_ptr__);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&clock_ids._M_h._M_bucket_count);
  }
  return __return_storage_ptr__;
}

Assistant:

tchecker::variable_access_map_t variable_access(tchecker::ta::system_t const & system)
{
  tchecker::variable_access_map_t map;

  for (tchecker::system::edge_const_shared_ptr_t edge : system.edges()) {
    tchecker::add_accesses(system.guard(edge->id()), edge->pid(), map);
    tchecker::add_accesses(system.statement(edge->id()), edge->pid(), map);
  }

  for (tchecker::system::loc_const_shared_ptr_t loc : system.locations())
    tchecker::add_accesses(system.invariant(loc->id()), loc->pid(), map);

  return map;
}